

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.h
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::TPZCompElH1(TPZCompElH1<pzshape::TPZShapePrism> *this)

{
  long local_20;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0178d450;
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePrism>,&PTR_PTR_017870a8);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_01786cd8;
  local_20 = -1;
  TPZManVector<long,_21>::TPZManVector(&this->fConnectIndexes,0x15,&local_20);
  this->fh1fam = EH1Standard;
  return;
}

Assistant:

TPZCompElH1() = default;